

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Db *pDVar2;
  Index *pIVar3;
  Schema *pSchema;
  FKey *pFVar4;
  int iVar5;
  int err_code;
  Incrblob *p;
  Parse *pParse;
  Table *pTVar6;
  Index **ppIVar7;
  Vdbe *p_00;
  FKey **ppFVar8;
  Op *pOVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  char *local_80;
  uint local_78;
  int local_74;
  Parse *local_70;
  uint local_68;
  int local_64;
  VdbeOp *local_60;
  char *local_58;
  char *local_50;
  char **local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_80 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_74 = wrFlag;
  local_58 = zTable;
  local_50 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  pParse = (Parse *)0x0;
  if (p == (Incrblob *)0x0) {
LAB_0011ac47:
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p;
      err_code = 0;
      goto LAB_0011acf0;
    }
    err_code = 0;
LAB_0011ac51:
    if (p != (Incrblob *)0x0) goto LAB_0011acd0;
  }
  else {
    pParse = (Parse *)sqlite3DbMallocRaw(db,0x250);
    if (pParse == (Parse *)0x0) {
      pParse = (Parse *)0x0;
      goto LAB_0011ac47;
    }
    local_78 = (uint)(wrFlag != 0);
    local_48 = &pParse->zErrMsg;
    uVar13 = 0;
    local_70 = pParse;
    iVar5 = 0;
    do {
      local_64 = iVar5;
      memset(local_48,0,0x248);
      pParse->db = db;
      sqlite3DbFree(db,local_80);
      local_80 = (char *)0x0;
      sqlite3BtreeEnterAll(db);
      pTVar6 = sqlite3LocateTable(pParse,0,local_58,local_38);
      if (pTVar6 == (Table *)0x0) {
LAB_0011aca5:
        if (pParse->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_80 = pParse->zErrMsg;
          pParse->zErrMsg = (char *)0x0;
        }
        sqlite3BtreeLeaveAll(db);
        err_code = 1;
        goto LAB_0011acd0;
      }
      if (pTVar6->nModuleArg != 0) {
        pcVar15 = "cannot open virtual table: %s";
LAB_0011ac96:
        sqlite3ErrorMsg(pParse,pcVar15,local_58);
        goto LAB_0011aca5;
      }
      if ((pTVar6->tabFlags & 0x20) != 0) {
        pcVar15 = "cannot open table without rowid: %s";
        goto LAB_0011ac96;
      }
      if (pTVar6->pSelect != (Select *)0x0) {
        pcVar15 = "cannot open view: %s";
        goto LAB_0011ac96;
      }
      p->pTab = pTVar6;
      pDVar2 = db->aDb;
      local_68 = uVar13;
      iVar5 = sqlite3SchemaToIndex(db,pTVar6->pSchema);
      p->zDb = pDVar2[iVar5].zDbSName;
      sVar1 = pTVar6->nCol;
      uVar12 = 0;
      if (0 < sVar1) {
        uVar12 = (ulong)(uint)(int)sVar1;
      }
      lVar10 = 0;
      for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        iVar5 = sqlite3StrICmp(*(char **)((long)&pTVar6->aCol->zName + lVar10),local_50);
        if (iVar5 == 0) {
          uVar12 = uVar14 & 0xffffffff;
          break;
        }
        lVar10 = lVar10 + 0x20;
      }
      pParse = local_70;
      uVar13 = (uint)uVar12;
      if (uVar13 == (int)sVar1) {
        sqlite3DbFree(db,(void *)0x0);
        pcVar11 = "no such column: \"%s\"";
        pcVar15 = local_50;
LAB_0011ad9a:
        local_80 = sqlite3MPrintf(db,pcVar11,pcVar15);
        sqlite3BtreeLeaveAll(db);
        err_code = 1;
        goto LAB_0011ac51;
      }
      if (local_74 != 0) {
        if ((db->flags & 0x4000) == 0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = (char *)0x0;
          ppFVar8 = &pTVar6->pFKey;
          while (pFVar4 = *ppFVar8, pFVar4 != (FKey *)0x0) {
            uVar14 = (ulong)(uint)pFVar4->nCol;
            if (pFVar4->nCol < 1) {
              uVar14 = 0;
            }
            for (lVar10 = 0; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
              if (*(uint *)((long)&pFVar4->aCol[0].iFrom + lVar10) == uVar13) {
                pcVar15 = "foreign key";
              }
            }
            ppFVar8 = &pFVar4->pNextFrom;
          }
        }
        ppIVar7 = &pTVar6->pIndex;
        while (pIVar3 = *ppIVar7, pIVar3 != (Index *)0x0) {
          for (uVar14 = 0; pIVar3->nKeyCol != uVar14; uVar14 = uVar14 + 1) {
            if (uVar13 == (int)pIVar3->aiColumn[uVar14]) {
              pcVar15 = "indexed";
            }
            if ((int)pIVar3->aiColumn[uVar14] == 0xfffffffe) {
              pcVar15 = "indexed";
            }
          }
          ppIVar7 = &pIVar3->pNext;
        }
        if (pcVar15 != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          pcVar11 = "cannot open %s column for writing";
          goto LAB_0011ad9a;
        }
      }
      p_00 = sqlite3VdbeCreate(local_70);
      p->pStmt = (sqlite3_stmt *)p_00;
      if (p_00 != (Vdbe *)0x0) {
        pSchema = pTVar6->pSchema;
        iVar5 = sqlite3SchemaToIndex(db,pSchema);
        pOVar9 = (Op *)(ulong)local_78;
        sqlite3VdbeAddOp4Int(p_00,2,iVar5,local_78,pSchema->schema_cookie,pSchema->iGeneration);
        if (0 < (long)p_00->nOp) {
          pOVar9 = p_00->aOp;
          pOVar9[(long)p_00->nOp + -1].p5 = 1;
        }
        local_60 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)pOVar9);
        sqlite3VdbeUsesBtree(p_00,iVar5);
        if (db->mallocFailed == '\0') {
          local_60->p1 = iVar5;
          local_60->p2 = pTVar6->tnum;
          local_60->p3 = local_78;
          sqlite3VdbeChangeP4(p_00,1,pTVar6->zName,0);
          if (db->mallocFailed == '\0') {
            if (local_74 != 0) {
              local_60[1].opcode = 'i';
            }
            local_60[1].p2 = pTVar6->tnum;
            local_60[1].p3 = iVar5;
            local_60[1].p4type = -3;
            local_60[1].p4.i = pTVar6->nCol + 1;
            local_60[3].p2 = (int)pTVar6->nCol;
            local_70->nVar = 0;
            local_70->nTab = 1;
            local_70->nMem = 1;
            sqlite3VdbeMakeReady(p_00,local_70);
          }
        }
      }
      p->iCol = (u16)uVar12;
      p->db = db;
      sqlite3BtreeLeaveAll(db);
      uVar13 = local_68;
      pParse = local_70;
      err_code = local_64;
      if ((db->mallocFailed != '\0') ||
         (err_code = blobSeekToRow(p,local_40,&local_80), 0x30 < uVar13)) break;
      uVar13 = uVar13 + 1;
      iVar5 = 0x11;
    } while (err_code == 0x11);
    if (err_code == 0) goto LAB_0011ac47;
LAB_0011acd0:
    if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
  }
  sqlite3DbFree(db,p);
LAB_0011acf0:
  pcVar11 = local_80;
  pcVar15 = "%s";
  if (local_80 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,err_code,pcVar15,local_80);
  sqlite3DbFree(db,pcVar11);
  sqlite3ParserReset(pParse);
  sqlite3DbFree(db,pParse);
  iVar5 = sqlite3ApiExit(db,err_code);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        pParse->nVar = 0;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}